

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall wabt::LocalTypes::Set(LocalTypes *this,TypeVector *types)

{
  pointer ppVar1;
  pointer pTVar2;
  uint uVar3;
  ulong uVar4;
  Type type;
  uint local_3c;
  Type local_38;
  
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->decls_).
      super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->decls_).
    super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    local_38 = *pTVar2;
    local_3c = 1;
    pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2)) {
      uVar4 = 1;
      uVar3 = 2;
      do {
        if (pTVar2[uVar4] == local_38) {
          local_3c = local_3c + 1;
        }
        else {
          std::
          vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
          ::emplace_back<wabt::Type&,unsigned_int&>
                    ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                      *)this,&local_38,&local_3c);
          local_38 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar4];
          local_3c = 1;
        }
        uVar4 = (ulong)uVar3;
        pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = uVar3 + 1;
      } while (uVar4 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3))
      ;
    }
    std::
    vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>::
    emplace_back<wabt::Type&,unsigned_int&>
              ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                *)this,&local_38,&local_3c);
  }
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}